

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

Ses_Man_t *
Ses_ManAlloc(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int fMakeAIG,
            int nBTLimit,int fVerbose)

{
  int iVar1;
  int iVar2;
  Ses_Man_t *pSVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar;
  word pMask [4];
  
  pSVar3 = (Ses_Man_t *)calloc(1,0x488);
  iVar1 = 0;
  uVar5 = 0;
  if (0 < nFunc) {
    uVar5 = (ulong)(uint)nFunc;
  }
  uVar6 = 0;
  for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    if ((pTruth[(int)((uint)uVar7 * 4)] & 1) != 0) {
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        pTruth[iVar1 + lVar8] = ~pTruth[iVar1 + lVar8];
      }
      uVar6 = uVar6 | 1 << ((uint)uVar7 & 0x1f);
      pSVar3->bSpecInv = uVar6;
    }
    iVar1 = iVar1 + 4;
  }
  pSVar3->pSpec = pTruth;
  pSVar3->nSpecVars = nVars;
  iVar1 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    iVar1 = 1;
  }
  pSVar3->nSpecFunc = nFunc;
  pSVar3->nSpecWords = iVar1;
  pSVar3->nRows = ~(-1 << ((byte)nVars & 0x1f));
  pSVar3->nMaxDepth = nMaxDepth;
  iVar1 = 0;
  if (nMaxDepth < 0) {
    pArrTimeProfile = (int *)0x0;
  }
  pSVar3->pArrTimeProfile = pArrTimeProfile;
  if (pArrTimeProfile != (int *)0x0) {
    iVar1 = Abc_NormalizeArrivalTimes(pArrTimeProfile,nVars,&pSVar3->nArrTimeMax);
    nFunc = pSVar3->nSpecFunc;
  }
  pSVar3->nArrTimeDelta = iVar1;
  pSVar3->fMakeAIG = fMakeAIG;
  pSVar3->nBTLimit = nBTLimit;
  pSVar3->fVerbose = fVerbose;
  pSVar3->fVeryVerbose = 0;
  pSVar3->fExtractVerbose = 0;
  pSVar3->fSatVerbose = 0;
  pVVar4 = Vec_IntAlloc(100);
  pSVar3->vPolar = pVVar4;
  pVVar4 = Vec_IntAlloc(10);
  pSVar3->vAssump = pVVar4;
  pVVar4 = Vec_IntAlloc(nVars);
  pSVar3->vStairDecVars = pVVar4;
  pSVar3->nRandRowAssigns = nVars * 2;
  pSVar3->fKeepRowAssigns = 0;
  if (nFunc == 1) {
    iVar1 = pSVar3->nSpecWords;
    Abc_TtMask(pMask,iVar1,iVar1 << 6);
    iVar = 0;
    iVar9 = pSVar3->nSpecVars;
    if (pSVar3->nSpecVars < 1) {
      iVar9 = iVar;
    }
    for (; iVar9 != iVar; iVar = iVar + 1) {
      iVar2 = Abc_TtIsTopDecomposable(pSVar3->pSpec,pMask,iVar1,iVar);
      if (iVar2 != 0) {
        pSVar3->pDecVars = pSVar3->pDecVars | 1 << ((byte)iVar & 0x1f);
      }
    }
  }
  srand(0xcafe);
  return pSVar3;
}

Assistant:

static inline Ses_Man_t * Ses_ManAlloc( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int fMakeAIG, int nBTLimit, int fVerbose )
{
    int h, i;

    Ses_Man_t * p = ABC_CALLOC( Ses_Man_t, 1 );
    p->pSat       = NULL;
    p->bSpecInv   = 0;
    for ( h = 0; h < nFunc; ++h )
        if ( pTruth[h << 2] & 1 )
        {
            for ( i = 0; i < 4; ++i )
                pTruth[(h << 2) + i] = ~pTruth[(h << 2) + i];
            p->bSpecInv |= ( 1 << h );
        }
    p->pSpec           = pTruth;
    p->nSpecVars       = nVars;
    p->nSpecFunc       = nFunc;
    p->nSpecWords      = Abc_TtWordNum( nVars );
    p->nRows           = ( 1 << nVars ) - 1;
    p->nMaxDepth       = nMaxDepth;
    p->pArrTimeProfile = nMaxDepth >= 0 ? pArrTimeProfile : NULL;
    if ( p->pArrTimeProfile )
        p->nArrTimeDelta = Abc_NormalizeArrivalTimes( p->pArrTimeProfile, nVars, &p->nArrTimeMax );
    else
        p->nArrTimeDelta = p->nArrTimeMax = 0;
    p->fMakeAIG        = fMakeAIG;
    p->nBTLimit        = nBTLimit;
    p->fVerbose        = fVerbose;
    p->fVeryVerbose    = 0;
    p->fExtractVerbose = 0;
    p->fSatVerbose     = 0;
    p->vPolar          = Vec_IntAlloc( 100 );
    p->vAssump         = Vec_IntAlloc( 10 );
    p->vStairDecVars   = Vec_IntAlloc( nVars );
    p->nRandRowAssigns = 2 * nVars;
    p->fKeepRowAssigns = 0;

    if ( p->nSpecFunc == 1 )
        Ses_ManComputeTopDec( p );

    srand( 0xCAFE );

    return p;
}